

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O1

Instance *
embree::createInstance(RTCScene scene,RTCScene object,int geomID,Vec3fa *lower,Vec3fa *upper)

{
  undefined8 uVar1;
  Instance *pIVar2;
  RTCTraversable pRVar3;
  RTCGeometry pRVar4;
  
  pIVar2 = (Instance *)alignedUSMMalloc(0xf0,0x10,DEVICE_READ_ONLY);
  pIVar2->type = USER_GEOMETRY_INSTANCE;
  pRVar3 = (RTCTraversable)rtcGetSceneTraversable(object);
  pIVar2->object = pRVar3;
  uVar1 = *(undefined8 *)((long)&lower->field_0 + 8);
  *(undefined8 *)&(pIVar2->lower).field_0 = *(undefined8 *)&lower->field_0;
  *(undefined8 *)((long)&(pIVar2->lower).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&upper->field_0 + 8);
  *(undefined8 *)&(pIVar2->upper).field_0 = *(undefined8 *)&upper->field_0;
  *(undefined8 *)((long)&(pIVar2->upper).field_0 + 8) = uVar1;
  *(undefined8 *)&(pIVar2->local2world).l.vx.field_0 = 0x3f800000;
  *(undefined8 *)((long)&(pIVar2->local2world).l.vx.field_0 + 8) = 0;
  *(undefined8 *)&(pIVar2->local2world).l.vy.field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(pIVar2->local2world).l.vy.field_0 + 8) = 0;
  *(undefined8 *)&(pIVar2->local2world).l.vz.field_0 = 0;
  *(undefined8 *)((long)&(pIVar2->local2world).l.vz.field_0 + 8) = 0x3f800000;
  *(undefined8 *)&(pIVar2->local2world).p.field_0 = 0;
  *(undefined8 *)((long)&(pIVar2->local2world).p.field_0 + 8) = 0;
  pRVar4 = (RTCGeometry)rtcNewGeometry(g_device,0x78);
  pIVar2->geometry = pRVar4;
  rtcSetGeometryUserPrimitiveCount(pRVar4,1);
  rtcSetGeometryUserData(pIVar2->geometry,pIVar2);
  rtcSetGeometryBoundsFunction(pIVar2->geometry,instanceBoundsFunc,0);
  rtcSetGeometryIntersectFunction(pIVar2->geometry,instanceIntersectFuncPtr);
  rtcSetGeometryOccludedFunction(pIVar2->geometry,instanceOccludedFuncPtr);
  rtcCommitGeometry(pIVar2->geometry);
  rtcAttachGeometry(scene,pIVar2->geometry);
  rtcReleaseGeometry(pIVar2->geometry);
  return pIVar2;
}

Assistant:

Instance* createInstance (RTCScene scene, RTCScene object, int geomID, const Vec3fa& lower, const Vec3fa& upper)
{
#if !ENABLE_NATIVE_INSTANCING
  Instance* instance = (Instance*) alignedUSMMalloc(sizeof(Instance),16);
  instance->type = USER_GEOMETRY_INSTANCE;
  instance->object = rtcGetSceneTraversable(object);
  instance->lower = lower;
  instance->upper = upper;
  instance->local2world.l.vx = Vec3fa(1,0,0);
  instance->local2world.l.vy = Vec3fa(0,1,0);
  instance->local2world.l.vz = Vec3fa(0,0,1);
  instance->local2world.p    = Vec3fa(0,0,0);
  instance->geometry = rtcNewGeometry(g_device, RTC_GEOMETRY_TYPE_USER);
  rtcSetGeometryUserPrimitiveCount(instance->geometry,1);
  rtcSetGeometryUserData(instance->geometry,instance);
  rtcSetGeometryBoundsFunction(instance->geometry,instanceBoundsFunc,nullptr);
  rtcSetGeometryIntersectFunction(instance->geometry,instanceIntersectFuncPtr);
  rtcSetGeometryOccludedFunction (instance->geometry,instanceOccludedFuncPtr);
  rtcCommitGeometry(instance->geometry);
  rtcAttachGeometry(scene,instance->geometry);
  rtcReleaseGeometry(instance->geometry);
  return instance;
#else
  Instance* instance = (Instance*) alignedUSMMalloc(sizeof(Instance),16);
  instance->type = USER_GEOMETRY_INSTANCE;
  instance->geometry = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_INSTANCE);
  rtcSetGeometryInstancedScene(instance->geometry,object);
  rtcSetGeometryTimeStepCount(instance->geometry,1);
  rtcCommitGeometry(instance->geometry);
  rtcAttachGeometryByID(scene,instance->geometry,geomID);
  rtcReleaseGeometry(instance->geometry);
  return instance;
#endif
}